

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMuxes.c
# Opt level: O1

Gia_Man_t * Gia_ManCofStructure(Gia_Man_t *p)

{
  uint uVar1;
  void *__ptr;
  Gia_Man_t *p_00;
  uint uVar2;
  Vec_Int_t *vRes;
  Vec_Wec_t *vCofs;
  Vec_Int_t *vMap;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  Gia_Man_t *pNew;
  Gia_Man_t *local_30;
  
  local_30 = (Gia_Man_t *)0x0;
  vRes = Gia_ManFindSharedInputs(p);
  if (vRes == (Vec_Int_t *)0x0) {
    vCofs = (Vec_Wec_t *)0x0;
  }
  else {
    vCofs = Gia_ManFindCofs(p,vRes,&local_30);
  }
  if (vCofs == (Vec_Wec_t *)0x0) {
    vMap = (Vec_Int_t *)0x0;
  }
  else {
    vMap = Gia_ManFindEquivClasses(vCofs);
  }
  if (vMap != (Vec_Int_t *)0x0) {
    uVar3 = vMap->nSize;
    if ((ulong)uVar3 == 0) {
      uVar2 = 0;
    }
    else {
      uVar2 = *vMap->pArray;
      if (1 < (int)uVar3) {
        uVar4 = 1;
        do {
          uVar1 = vMap->pArray[uVar4];
          if ((int)uVar2 <= (int)uVar1) {
            uVar2 = uVar1;
          }
          uVar4 = uVar4 + 1;
        } while (uVar3 != uVar4);
      }
    }
    uVar3 = uVar2 + 1;
    if (1 < uVar3) {
      if (uVar2 == 0) {
        uVar3 = 0;
      }
      else {
        uVar3 = 0x1f;
        if (uVar2 != 0) {
          for (; uVar2 >> uVar3 == 0; uVar3 = uVar3 - 1) {
          }
        }
        uVar3 = (uVar3 ^ 0xffffffe0) + 0x21;
      }
    }
    if ((int)uVar3 < vRes->nSize) {
      Gia_ManFindDerive(local_30,p->vCos->nSize,vRes,vCofs,vMap);
      p_00 = local_30;
      local_30 = Gia_ManCleanup(local_30);
      Gia_ManStop(p_00);
      goto LAB_002241ca;
    }
  }
  Gia_ManStopP(&local_30);
LAB_002241ca:
  if (vCofs != (Vec_Wec_t *)0x0) {
    if (0 < vCofs->nCap) {
      lVar5 = 8;
      lVar6 = 0;
      do {
        __ptr = *(void **)((long)&vCofs->pArray->nCap + lVar5);
        if (__ptr != (void *)0x0) {
          free(__ptr);
          *(undefined8 *)((long)&vCofs->pArray->nCap + lVar5) = 0;
        }
        lVar6 = lVar6 + 1;
        lVar5 = lVar5 + 0x10;
      } while (lVar6 < vCofs->nCap);
    }
    if (vCofs->pArray != (Vec_Int_t *)0x0) {
      free(vCofs->pArray);
      vCofs->pArray = (Vec_Int_t *)0x0;
    }
    vCofs->nCap = 0;
    vCofs->nSize = 0;
    free(vCofs);
  }
  if (vMap != (Vec_Int_t *)0x0) {
    if (vMap->pArray != (int *)0x0) {
      free(vMap->pArray);
      vMap->pArray = (int *)0x0;
    }
    free(vMap);
  }
  if (vRes != (Vec_Int_t *)0x0) {
    if (vRes->pArray != (int *)0x0) {
      free(vRes->pArray);
      vRes->pArray = (int *)0x0;
    }
    free(vRes);
  }
  return local_30;
}

Assistant:

Gia_Man_t * Gia_ManCofStructure( Gia_Man_t * p )
{
    Gia_Man_t * pNew = NULL;
    Vec_Int_t * vIns = Gia_ManFindSharedInputs( p );
    Vec_Wec_t * vCfs = vIns ? Gia_ManFindCofs( p, vIns, &pNew ) : NULL;
    Vec_Int_t * vMap = vCfs ? Gia_ManFindEquivClasses( vCfs ) : NULL;
    if ( vMap && Abc_Base2Log(Vec_IntFindMax(vMap)+1) < Vec_IntSize(vIns) ) 
    {
        Gia_Man_t * pTemp; 
        Gia_ManFindDerive( pNew, Gia_ManCoNum(p), vIns, vCfs, vMap );
        pNew = Gia_ManCleanup( pTemp = pNew );
        Gia_ManStop( pTemp );
    }
    else
        Gia_ManStopP( &pNew );
    Vec_WecFreeP( &vCfs );
    Vec_IntFreeP( &vMap );
    Vec_IntFreeP( &vIns );
    return pNew;
}